

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_function_createPrimitive
          (sysbvm_context_t *context,size_t argumentCount,sysbvm_bitflags_t flags,void *userdata,
          sysbvm_functionEntryPoint_t entryPoint)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  char *primitiveName;
  sysbvm_object_tuple_t *psStack_38;
  uint32_t primitiveEntryIndex;
  sysbvm_function_t *result;
  sysbvm_functionEntryPoint_t entryPoint_local;
  void *userdata_local;
  sysbvm_bitflags_t flags_local;
  size_t argumentCount_local;
  sysbvm_context_t *context_local;
  
  result = (sysbvm_function_t *)entryPoint;
  entryPoint_local = (sysbvm_functionEntryPoint_t)userdata;
  userdata_local = (void *)flags;
  flags_local = argumentCount;
  argumentCount_local = (size_t)context;
  psStack_38 = sysbvm_context_allocatePointerTuple(context,(context->roots).functionType,0xc);
  sVar2 = sysbvm_tuple_size_encode((sysbvm_context_t *)argumentCount_local,flags_local);
  psStack_38[2].header.field_0.typePointer = sVar2;
  sVar2 = sysbvm_tuple_bitflags_encode((sysbvm_bitflags_t)userdata_local);
  psStack_38[1].field_1.pointers[0] = sVar2;
  sVar2 = sysbvm_tuple_uint32_encode((sysbvm_context_t *)argumentCount_local,0);
  psStack_38[3].header.identityHashAndFlags = (int)sVar2;
  psStack_38[3].header.objectSize = (int)(sVar2 >> 0x20);
  primitiveName._4_4_ = 0;
  if ((entryPoint_local == (sysbvm_functionEntryPoint_t)0x0) &&
     (_Var1 = sysbvm_primitiveTable_findEntryFor
                        ((sysbvm_functionEntryPoint_t)result,(uint32_t *)((long)&primitiveName + 4))
     , _Var1)) {
    sVar2 = sysbvm_tuple_uint32_encode
                      ((sysbvm_context_t *)argumentCount_local,primitiveName._4_4_ + 1);
    psStack_38[3].header.identityHashAndFlags = (int)sVar2;
    psStack_38[3].header.objectSize = (int)(sVar2 >> 0x20);
    if (sysbvm_primitiveTable[primitiveName._4_4_].name != (char *)0x0) {
      sVar2 = sysbvm_symbol_internWithCString
                        ((sysbvm_context_t *)argumentCount_local,
                         sysbvm_primitiveTable[primitiveName._4_4_].name);
      psStack_38[3].field_1.pointers[0] = sVar2;
    }
  }
  return (sysbvm_tuple_t)psStack_38;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_function_createPrimitive(sysbvm_context_t *context, size_t argumentCount, sysbvm_bitflags_t flags, void *userdata, sysbvm_functionEntryPoint_t entryPoint)
{
    sysbvm_function_t *result = (sysbvm_function_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_function_t));
    result->argumentCount = sysbvm_tuple_size_encode(context, argumentCount);
    result->flags = sysbvm_tuple_bitflags_encode(flags);
    result->primitiveTableIndex = sysbvm_tuple_uint32_encode(context, 0);
    uint32_t primitiveEntryIndex = 0;
    if(!userdata && sysbvm_primitiveTable_findEntryFor(entryPoint, &primitiveEntryIndex))
    {
        result->primitiveTableIndex = sysbvm_tuple_uint32_encode(context, primitiveEntryIndex + 1);
        const char *primitiveName = sysbvm_primitiveTable[primitiveEntryIndex].name;
        if(primitiveName)
            result->primitiveName = sysbvm_symbol_internWithCString(context, primitiveName);
    }
    return (sysbvm_tuple_t)result;
}